

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O2

uint crnlib::dxt1_block::get_block_colors3(color_quad_u8 *pDst,uint16 color0,uint16 color1)

{
  dxt1_block in_RAX;
  color_quad_u8 c1;
  color_quad_u8 c0;
  
  _c1 = in_RAX;
  unpack_color((dxt1_block *)&c0,color0,true,0xff);
  unpack_color((dxt1_block *)&c1,color1,true,0xff);
  (pDst->field_0).field_0 =
       (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0)
       c0;
  pDst[1].field_0.field_0 =
       (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0)
       c1.field_0;
  pDst[2].field_0.field_0.r = (uchar)(((uint)c1.field_0 & 0xff) + ((uint)c0.field_0 & 0xff) >> 1);
  pDst[2].field_0.field_0.g =
       (uchar)(((uint)c1.field_0 >> 8 & 0xff) + ((uint)c0.field_0 >> 8 & 0xff) >> 1);
  pDst[2].field_0.field_0.b =
       (uchar)(((uint)c1.field_0 >> 0x10 & 0xff) + ((uint)c0.field_0 >> 0x10 & 0xff) >> 1);
  pDst[2].field_0.field_0.a = 0xff;
  pDst[3].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  return 3;
}

Assistant:

uint dxt1_block::get_block_colors3(color_quad_u8* pDst, uint16 color0, uint16 color1) {
  color_quad_u8 c0(unpack_color(color0, true));
  color_quad_u8 c1(unpack_color(color1, true));

  pDst[0] = c0;
  pDst[1] = c1;
  pDst[2].set_noclamp_rgba((c0.r + c1.r) >> 1U, (c0.g + c1.g) >> 1U, (c0.b + c1.b) >> 1U, 255U);
  pDst[3].set_noclamp_rgba(0, 0, 0, 0);

  return 3;
}